

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

string * __thiscall
glcts::ViewportArray::DrawMultipleLayers::getGeometryShader_abi_cxx11_
          (string *__return_storage_ptr__,DrawMultipleLayers *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${GEOMETRY_SHADER_ENABLE}\n${VIEWPORT_ARRAY_ENABLE}\n\nlayout(points, invocations = 16)         in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nflat out int gs_fs_color;\n\nvoid main()\n{\n    gs_fs_color      = gl_InvocationID;\n    gl_ViewportIndex = gl_InvocationID;\n    gl_Layer         = gl_InvocationID;\n    gl_Position  = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    gs_fs_color      = gl_InvocationID;\n    gl_ViewportIndex = gl_InvocationID;\n    gl_Layer         = gl_InvocationID;\n    gl_Position  = vec4(-1, 1, 0, 1);\n    EmitVertex();\n    gs_fs_color      = gl_InvocationID;\n    gl_ViewportIndex = gl_InvocationID;\n    gl_Layer         = gl_InvocationID;\n    gl_Position  = vec4(1, -1, 0, 1);\n    EmitVertex();\n    gs_fs_color      = gl_InvocationID;\n    gl_ViewportIndex = gl_InvocationID;\n    gl_Layer         = gl_InvocationID;\n    gl_Position  = vec4(1, 1, 0, 1);\n    EmitVertex();\n}\n\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string DrawMultipleLayers::getGeometryShader()
{
	static const GLchar* source = "${VERSION}\n"
								  "\n"
								  "${GEOMETRY_SHADER_ENABLE}\n"
								  "${VIEWPORT_ARRAY_ENABLE}\n"
								  "\n"
								  "layout(points, invocations = 16)         in;\n"
								  "layout(triangle_strip, max_vertices = 4) out;\n"
								  "\n"
								  "flat out int gs_fs_color;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    gs_fs_color      = gl_InvocationID;\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Layer         = gl_InvocationID;\n"
								  "    gl_Position  = vec4(-1, -1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "    gs_fs_color      = gl_InvocationID;\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Layer         = gl_InvocationID;\n"
								  "    gl_Position  = vec4(-1, 1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "    gs_fs_color      = gl_InvocationID;\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Layer         = gl_InvocationID;\n"
								  "    gl_Position  = vec4(1, -1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "    gs_fs_color      = gl_InvocationID;\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Layer         = gl_InvocationID;\n"
								  "    gl_Position  = vec4(1, 1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "}\n"
								  "\n";

	std::string result = source;

	return result;
}